

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

int Llb_ManCutVolume(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  Aig_ManIncrementTravId(p);
  iVar3 = vLower->nSize;
  if (0 < (long)iVar3) {
    ppvVar1 = vLower->pArray;
    iVar2 = p->nTravIds;
    lVar4 = 0;
    do {
      *(int *)((long)ppvVar1[lVar4] + 0x20) = iVar2;
      lVar4 = lVar4 + 1;
    } while (iVar3 != lVar4);
  }
  if (vUpper->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      iVar2 = Llb_ManCutVolume_rec(p,(Aig_Obj_t *)vUpper->pArray[lVar4]);
      iVar3 = iVar3 + iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vUpper->nSize);
  }
  return iVar3;
}

Assistant:

int Llb_ManCutVolume( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // mark the lower cut with the traversal ID
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // count the upper cut
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
        Counter += Llb_ManCutVolume_rec( p, pObj );
    return Counter;
}